

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_functions.h
# Opt level: O0

void TestGMAA(Arguments *args)

{
  BGIP_SolverCreatorInterface *pBVar1;
  ostream *poVar2;
  long in_RDI;
  GMAA_MAAstarClassic gmaa_maa3;
  GMAA_MAAstarClassic gmaa_maa;
  QBG qbg;
  QPOMDP qpomdp;
  double V;
  QMDP qmdp;
  GMAA_kGMAA gmaa_em;
  PlanningUnitMADPDiscreteParameters params;
  ProblemDecTiger pdt;
  undefined8 in_stack_ffffffffffffee58;
  int s;
  ProblemDecTiger *in_stack_ffffffffffffee60;
  size_t in_stack_ffffffffffffee68;
  undefined8 in_stack_ffffffffffffee70;
  int verbose;
  size_t in_stack_ffffffffffffee78;
  BGIP_SolverCreator_AM<JointPolicyPureVector> *in_stack_ffffffffffffee80;
  DecPOMDPDiscreteInterface *local_1178;
  QFunctionJAOHInterface *local_1130;
  DecPOMDPDiscreteInterface *local_1128;
  QFunctionJAOHInterface *local_1090;
  DecPOMDPDiscreteInterface *local_1088;
  GMAA_MAAstarClassic local_1078 [1088];
  GMAA_MAAstarClassic local_c38 [1088];
  QBG local_7f8 [96];
  QPOMDP local_798 [96];
  double local_738;
  long local_730 [14];
  GMAA_kGMAA local_6c0 [1119];
  PlanningUnitMADPDiscreteParameters local_261 [9];
  ProblemDecTiger local_258;
  long local_8;
  
  s = (int)((ulong)in_stack_ffffffffffffee58 >> 0x20);
  verbose = (int)((ulong)in_stack_ffffffffffffee70 >> 0x20);
  local_8 = in_RDI;
  ProblemDecTiger::ProblemDecTiger(&local_258);
  PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_261);
  PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_261,0));
  pBVar1 = (BGIP_SolverCreatorInterface *)operator_new(0x28);
  BGIP_SolverCreator_AM<JointPolicyPureVector>::BGIP_SolverCreator_AM
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,verbose,in_stack_ffffffffffffee68,
             (double)in_stack_ffffffffffffee60);
  local_1088 = (DecPOMDPDiscreteInterface *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x258) {
    local_1088 = (DecPOMDPDiscreteInterface *)
                 (&local_258.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                   super_MultiAgentDecisionProcess.field_0x0 +
                 *(long *)(local_258.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                           super_MultiAgentDecisionProcess._0_8_ + -0x50));
  }
  GMAA_kGMAA::GMAA_kGMAA(local_6c0,pBVar1,2,local_1088,local_261,1);
  QMDP::QMDP((QMDP *)local_730,(PlanningUnitDecPOMDPDiscrete *)local_6c0,false);
  QMDP::Compute();
  local_1090 = (QFunctionJAOHInterface *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x730) {
    local_1090 = (QFunctionJAOHInterface *)((long)local_730 + *(long *)(local_730[0] + -0x98));
  }
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetQHeuristic
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)local_6c0,local_1090);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Print()---------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  PlanningUnitMADPDiscrete::Print();
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Plan()- QMDP - horizon=2------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  time((time_t *)0x0);
  PlanningUnit::SetSeed((PlanningUnit *)in_stack_ffffffffffffee60,s);
  local_738 = -1.79769313486232e+308;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::Plan
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x120c62);
  local_738 = GeneralizedMAAStarPlannerForDecPOMDPDiscrete::GetExpectedReward
                        ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x120c71);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\napprox. value=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_738);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  QPOMDP::QPOMDP(local_798,(PlanningUnitDecPOMDPDiscrete *)local_6c0);
  QFunctionJAOHTree::Compute();
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetQHeuristic
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)local_6c0,
             (QFunctionJAOHInterface *)local_798);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Plan()- QPOMDP - horizon=2----");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::Plan
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x120e37);
  local_738 = GeneralizedMAAStarPlannerForDecPOMDPDiscrete::GetExpectedReward
                        ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x120e46);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\napprox. value=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_738);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  QBG::QBG(local_7f8,(PlanningUnitDecPOMDPDiscrete *)local_6c0);
  QFunctionJAOHTree::Compute();
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetQHeuristic
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)local_6c0,
             (QFunctionJAOHInterface *)local_7f8);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-gmaa_em.Plan()- QBG - horizon=2----");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::Plan
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x120f8f);
  local_738 = GeneralizedMAAStarPlannerForDecPOMDPDiscrete::GetExpectedReward
                        ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x120f9e);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\napprox. value=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_738);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::istream::get();
  }
  local_1128 = (DecPOMDPDiscreteInterface *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x258) {
    local_1128 = (DecPOMDPDiscreteInterface *)
                 (&local_258.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                   super_MultiAgentDecisionProcess.field_0x0 +
                 *(long *)(local_258.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                           super_MultiAgentDecisionProcess._0_8_ + -0x50));
  }
  GMAA_MAAstarClassic::GMAA_MAAstarClassic(local_c38,2,local_1128,local_261,0);
  QMDP::SetPU((PlanningUnitDecPOMDPDiscrete *)local_730);
  QMDP::Compute();
  local_1130 = (QFunctionJAOHInterface *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x730) {
    local_1130 = (QFunctionJAOHInterface *)((long)local_730 + *(long *)(local_730[0] + -0x98));
  }
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetQHeuristic
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)local_c38,local_1130);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-gmaa_maa.Print()---------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  PlanningUnitMADPDiscrete::Print();
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-gmaa_maa.Plan()- QMDP - horizon=2----------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  time((time_t *)0x0);
  PlanningUnit::SetSeed((PlanningUnit *)in_stack_ffffffffffffee60,s);
  local_738 = GeneralizedMAAStarPlannerForDecPOMDPDiscrete::GetExpectedReward
                        ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x121238);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\nexact. value=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_738);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"press <enter> to continue...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::istream::get();
  }
  local_1178 = (DecPOMDPDiscreteInterface *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x258) {
    local_1178 = (DecPOMDPDiscreteInterface *)
                 (&local_258.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                   super_MultiAgentDecisionProcess.field_0x0 +
                 *(long *)(local_258.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete.
                           super_MultiAgentDecisionProcess._0_8_ + -0x50));
  }
  GMAA_MAAstarClassic::GMAA_MAAstarClassic(local_1078,3,local_1178,local_261,0);
  QFunctionJAOHTree::SetPU((PlanningUnitDecPOMDPDiscrete *)local_7f8);
  QFunctionJAOHTree::Compute();
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetQHeuristic
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)local_1078,
             (QFunctionJAOHInterface *)local_7f8);
  poVar2 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-gmaa_maa3.Print()---------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  PlanningUnitMADPDiscrete::Print();
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "-gmaa_maa.Plan()- QMDP - horizon=3----------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::Plan
            ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x12143c);
  local_738 = GeneralizedMAAStarPlannerForDecPOMDPDiscrete::GetExpectedReward
                        ((GeneralizedMAAStarPlannerForDecPOMDPDiscrete *)0x12144b);
  if ((*(byte *)(local_8 + 4) & 1) == 0) {
    in_stack_ffffffffffffee60 =
         (ProblemDecTiger *)std::operator<<((ostream *)&std::cout,"\nexact. value=");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)in_stack_ffffffffffffee60,local_738);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  GMAA_MAAstarClassic::~GMAA_MAAstarClassic((GMAA_MAAstarClassic *)0x1214e7);
  GMAA_MAAstarClassic::~GMAA_MAAstarClassic((GMAA_MAAstarClassic *)0x1214f4);
  QBG::~QBG(local_7f8);
  QPOMDP::~QPOMDP(local_798);
  QMDP::~QMDP((QMDP *)local_730);
  GMAA_kGMAA::~GMAA_kGMAA((GMAA_kGMAA *)0x121528);
  PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_261);
  ProblemDecTiger::~ProblemDecTiger(in_stack_ffffffffffffee60);
  return;
}

Assistant:

void TestGMAA(const ArgumentHandlers::Arguments& args)
{
    ProblemDecTiger pdt;
//    GeneralizedMAAStarPlanner gmaa(2, &pdt);

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    GMAA_kGMAA gmaa_em(new BGIP_SolverCreator_AM<JointPolicyPureVector>(), 2, &pdt,&params);

    QMDP qmdp = QMDP(&gmaa_em);
    qmdp.Compute();
    gmaa_em.SetQHeuristic(&qmdp);
    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Print()---------------------"<<endl;
    gmaa_em.Print();

    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QMDP - horizon=2------"<<endl;
    gmaa_em.SetSeed(time(0));
    double V = -DBL_MAX;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value=" << V << endl;
    
    QPOMDP qpomdp = QPOMDP(&gmaa_em);
    qpomdp.Compute();
    gmaa_em.SetQHeuristic(&qpomdp);
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QPOMDP - horizon=2----"<<endl;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value="<< V << endl;

    QBG qbg = QBG(&gmaa_em);
    qbg.Compute();
    gmaa_em.SetQHeuristic(&qbg);
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_em.Plan()- QBG - horizon=2----"<<endl;
    gmaa_em.Plan();
    V = gmaa_em.GetExpectedReward();
    if (!args.testMode)
        cout << "\napprox. value="<< V << endl;
    
//    gmaa_em.ClearActionObservationHistories();
//    gmaa_em.ClearJointActionObservationHistories();       

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
    
    GMAA_MAAstarClassic gmaa_maa(2, &pdt,&params);
//    bool calculateJointBeliefs = true;
//    gmaa_maa.CreateActionObservationHistories();
//    gmaa_maa.CreateJointActionObservationHistories(calculateJointBeliefs);    
//    QMDP qmdp = QMDP(gmaa_maa);
    qmdp.SetPU(&gmaa_maa);
    qmdp.Compute();
    gmaa_maa.SetQHeuristic(&qmdp);
    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa.Print()---------------------"<<endl;
    gmaa_maa.Print();

    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa.Plan()- QMDP - horizon=2----------------"<<endl;
    gmaa_maa.SetSeed(time(0));
//    double V = -DBL_MAX;
    V = gmaa_maa.GetExpectedReward();
    if (!args.testMode)
        cout << "\nexact. value="<< V << endl;
//    gmaa_maa.ClearActionObservationHistories();
//    gmaa_maa.ClearJointActionObservationHistories();    

    if (!args.testMode)
    {
        cout << "press <enter> to continue..."<<endl;
        cin.get();
    }
//    gmaa_maa.SetHorizon(3);
//    gmaa_maa.SetInitialized(true);
    GMAA_MAAstarClassic gmaa_maa3(3, &pdt, &params);
//    gmaa_maa3.CreateActionObservationHistories();
//    gmaa_maa3.CreateJointActionObservationHistories(calculateJointBeliefs);    

    qbg.SetPU(&gmaa_maa3);
    qbg.Compute();
    gmaa_maa3.SetQHeuristic(qbg);    
    cout << "---------------------------------------"<<endl;
    cout << "-gmaa_maa3.Print()---------------------"<<endl;
    gmaa_maa3.Print();
    cout << "-gmaa_maa.Plan()- QMDP - horizon=3----------------"<<endl;
    gmaa_maa3.Plan();
    V = gmaa_maa3.GetExpectedReward();
    if (!args.testMode)
        cout << "\nexact. value="<< V << endl;
//    gmaa_maa3.ClearActionObservationHistories();
//    gmaa_maa3.ClearJointActionObservationHistories();    


    
    return;
}